

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int fffi2i1(short *input,long ntodo,double scale,double zero,int nullcheck,short tnull,uchar nullval
           ,char *nullarray,int *anynull,uchar *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  char *nullarray_local;
  uchar nullval_local;
  short tnull_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  short *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
        dVar1 = (double)(int)input[(long)dvalue] * scale + zero;
        if (-0.49 <= dVar1) {
          if (dVar1 <= 255.49) {
            output[(long)dvalue] = (uchar)(int)dVar1;
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = 0xff;
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = '\0';
        }
      }
    }
    else {
      for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
        if (input[(long)dvalue] < 0) {
          *status = -0xb;
          output[(long)dvalue] = '\0';
        }
        else if (input[(long)dvalue] < 0x100) {
          output[(long)dvalue] = (uchar)input[(long)dvalue];
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = 0xff;
        }
      }
    }
  }
  else if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      if (input[(long)dvalue] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[(long)dvalue] = nullval;
        }
        else {
          nullarray[(long)dvalue] = '\x01';
        }
      }
      else {
        dVar1 = (double)(int)input[(long)dvalue] * scale + zero;
        if (-0.49 <= dVar1) {
          if (dVar1 <= 255.49) {
            output[(long)dvalue] = (uchar)(int)dVar1;
          }
          else {
            *status = -0xb;
            output[(long)dvalue] = 0xff;
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = '\0';
        }
      }
    }
  }
  else {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      if (input[(long)dvalue] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[(long)dvalue] = nullval;
        }
        else {
          nullarray[(long)dvalue] = '\x01';
        }
      }
      else if (input[(long)dvalue] < 0) {
        *status = -0xb;
        output[(long)dvalue] = '\0';
      }
      else if (input[(long)dvalue] < 0x100) {
        output[(long)dvalue] = (uchar)input[(long)dvalue];
      }
      else {
        *status = -0xb;
        output[(long)dvalue] = 0xff;
      }
    }
  }
  return *status;
}

Assistant:

int fffi2i1(short *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            short tnull,          /* I - value of FITS TNULLn keyword if any */
            unsigned char nullval,/* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            unsigned char *output,/* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > UCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UCHAR_MAX;
                }
                else
                    output[ii] = (unsigned char) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UCHAR_MAX;
                }
                else
                    output[ii] = (unsigned char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }

                else
                {
                    if (input[ii] < 0)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > UCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UCHAR_MAX;
                    }
                    else
                        output[ii] = (unsigned char) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UCHAR_MAX;
                    }
                    else
                        output[ii] = (unsigned char) dvalue;
                }
            }
        }
    }
    return(*status);
}